

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

void __thiscall
TPZSkylMatrix<std::complex<float>_>::AddKel
          (TPZSkylMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *elmat,
          TPZVec<long> *source,TPZVec<long> *destination)

{
  _ComplexT _Var1;
  _ComplexT _Var2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  complex<float> *pcVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  lVar3 = source->fNElements;
  if (0 < lVar3) {
    lVar10 = 0;
    do {
      lVar4 = destination->fStore[lVar10];
      lVar5 = source->fStore[lVar10];
      lVar9 = lVar10;
      do {
        lVar12 = destination->fStore[lVar9];
        lVar11 = lVar4 - lVar12;
        if (lVar4 - lVar12 == 0 || lVar4 < lVar12) {
          lVar11 = -(lVar4 - lVar12);
        }
        lVar6 = source->fStore[lVar9];
        if (lVar12 < lVar4) {
          lVar12 = lVar4;
        }
        lVar7 = (elmat->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
        if (((lVar7 <= lVar5 || lVar5 < 0) || (lVar6 < 0)) ||
           ((elmat->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar6)) {
          TPZFMatrix<std::complex<float>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pcVar8 = (this->fElem).fStore[lVar12];
        _Var1 = elmat->fElem[lVar7 * lVar6 + lVar5]._M_value;
        _Var2 = pcVar8[lVar11]._M_value;
        pcVar8[lVar11]._M_value =
             CONCAT44((float)(_Var2 >> 0x20) + (float)(_Var1 >> 0x20),(float)_Var2 + (float)_Var1);
        lVar9 = lVar9 + 1;
      } while (lVar9 < lVar3);
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar3);
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::AddKel(TPZFMatrix<TVar>&elmat,
                                 TPZVec<int64_t> &source,
                                 TPZVec<int64_t> &destination)
{
    int64_t nelem = source.NElements();
    int64_t icoef,jcoef,ieq,jeq,ieqs,jeqs;
    for(icoef=0; icoef<nelem; icoef++) {
        ieq = destination[icoef];
        ieqs = source[icoef];
        for(jcoef=icoef; jcoef<nelem; jcoef++) {
            jeq = destination[jcoef];
            jeqs = source[jcoef];
            int64_t row(ieq), col(jeq);
            // invertendo linha-coluna para triangular superior
            if (row > col)
                this->Swap(&row, &col);
#ifdef PZDEBUG
            // checando limites
            if(row >= this->Dim() || col >= this->Dim()) {
                cout << "TPZSkylMatrix::GetVal index out of range row = " <<
                row << " col = " << col << endl;
                DebugStop();
            }
#endif
            // indice do vetor coluna
            int64_t index = col - row;
#ifdef PZDEBUG
            // checando limite da coluna
            if (index >= Size(col)) {
                cerr << "Try TPZSkylMatrix gZero." << endl;
                DebugStop();
            }
#endif
            // executando contribuição
            fElem[col][index] += elmat(ieqs,jeqs);

        }
    }
}